

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

bool __thiscall cmCTestRunTest::StartTest(cmCTestRunTest *this,size_t total)

{
  string *psVar1;
  uint uVar2;
  cmCTest *pcVar3;
  cmCTestTestProperties *pcVar4;
  bool bVar5;
  ostream *poVar6;
  cmProcess *pcVar7;
  string *psVar8;
  cmCTestTestProperties *pcVar9;
  long lVar10;
  pointer pbVar11;
  double testTimeOut;
  string msg;
  char *local_1c0 [4];
  ostringstream cmCTestLog_msg;
  long alStack_190 [45];
  
  this->TotalNumberOfTests = total;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  lVar10 = 0xe;
  if (total < 100) {
    lVar10 = (ulong)(9 < total) * 2 + 10;
  }
  *(long *)((long)alStack_190 + *(long *)(_cmCTestLog_msg + -0x18)) = lVar10;
  poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Start ");
  uVar2 = this->TestHandler->MaxIndex;
  lVar10 = 3;
  if (uVar2 < 100) {
    lVar10 = 2 - (ulong)(uVar2 < 10);
  }
  *(long *)(&poVar6->field_0x10 + (long)poVar6->_vptr_basic_ostream[-3]) = lVar10;
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->TestProperties->Index);
  poVar6 = std::operator<<(poVar6,": ");
  poVar6 = std::operator<<(poVar6,(string *)this->TestProperties);
  std::endl<char,std::char_traits<char>>(poVar6);
  pcVar3 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x1bf,msg._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  ComputeArguments(this);
  pcVar4 = this->TestProperties;
  (this->TestResult).Properties = pcVar4;
  (this->TestResult).ExecutionTime = 0.0;
  (this->TestResult).CompressOutput = false;
  (this->TestResult).ReturnValue = -1;
  psVar1 = &(this->TestResult).CompletionStatus;
  std::__cxx11::string::assign((char *)psVar1);
  (this->TestResult).Status = 8;
  (this->TestResult).TestCount = this->TestProperties->Index;
  std::__cxx11::string::_M_assign((string *)&this->TestResult);
  std::__cxx11::string::assign((char *)&(this->TestResult).Path);
  pbVar11 = (pcVar4->Args).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(pcVar4->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11) < 0x21) ||
     (bVar5 = std::operator==(pbVar11 + 1,"NOT_AVAILABLE"), !bVar5)) {
    pcVar9 = this->TestProperties;
    for (pbVar11 = (pcVar9->RequiredFiles).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar11 !=
        (pcVar9->RequiredFiles).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar11 = pbVar11 + 1) {
      std::__cxx11::string::string((string *)&msg,(string *)pbVar11);
      bVar5 = cmsys::SystemTools::FileExists(msg._M_dataplus._M_p);
      if (!bVar5) {
        pcVar7 = (cmProcess *)operator_new(0xc0);
        cmProcess::cmProcess(pcVar7);
        this->TestProcess = pcVar7;
        poVar6 = std::operator<<(this->TestHandler->LogFile,"Unable to find required file: ");
        poVar6 = std::operator<<(poVar6,(string *)&msg);
        std::endl<char,std::char_traits<char>>(poVar6);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Unable to find required file: ");
        poVar6 = std::operator<<(poVar6,(string *)&msg);
        std::endl<char,std::char_traits<char>>(poVar6);
        pcVar3 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x1f2,local_1c0[0],false);
        std::__cxx11::string::~string((string *)local_1c0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cmCTestLog_msg,"Unable to find required file: ",&msg);
        std::__cxx11::string::operator=
                  ((string *)&(this->TestResult).Output,(string *)&cmCTestLog_msg);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        std::__cxx11::string::assign((char *)&(this->TestResult).FullCommandLine);
        std::__cxx11::string::assign((char *)psVar1);
        goto LAB_003133cd;
      }
      std::__cxx11::string::~string((string *)&msg);
      pcVar9 = this->TestProperties;
    }
    bVar5 = std::operator==(&this->ActualCommand,"");
    if (bVar5) {
      pcVar7 = (cmProcess *)operator_new(0xc0);
      cmProcess::cmProcess(pcVar7);
      this->TestProcess = pcVar7;
      poVar6 = std::operator<<(this->TestHandler->LogFile,"Unable to find executable: ");
      poVar6 = std::operator<<(poVar6,(string *)
                                      ((pcVar4->Args).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Unable to find executable: ");
      poVar6 = std::operator<<(poVar6,(string *)
                                      ((pcVar4->Args).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
      std::endl<char,std::char_traits<char>>(poVar6);
      pcVar3 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x203,msg._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&msg);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg,"Unable to find executable: ",
                     (pcVar4->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
      std::__cxx11::string::operator=
                ((string *)&(this->TestResult).Output,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      std::__cxx11::string::assign((char *)&(this->TestResult).FullCommandLine);
      std::__cxx11::string::assign((char *)psVar1);
      (this->TestResult).Status = 0;
    }
    else {
      cmCTest::CurrentTime_abi_cxx11_((string *)&cmCTestLog_msg,this->CTest);
      std::__cxx11::string::operator=((string *)&this->StartTime,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      testTimeOut = ResolveTimeout(this);
      if (this->StopTimePassed == false) {
        bVar5 = ForkProcess(this,testTimeOut,this->TestProperties->ExplicitTimeout,
                            &this->TestProperties->Environment);
        return bVar5;
      }
    }
  }
  else {
    pcVar7 = (cmProcess *)operator_new(0xc0);
    cmProcess::cmProcess(pcVar7);
    this->TestProcess = pcVar7;
    msg._M_dataplus._M_p = (pointer)&msg.field_2;
    msg._M_string_length = 0;
    msg.field_2._M_local_buf[0] = '\0';
    psVar8 = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
    if (psVar8->_M_string_length == 0) {
      std::__cxx11::string::assign((char *)&msg);
    }
    else {
      std::__cxx11::string::assign((char *)&msg);
      cmCTest::GetConfigType_abi_cxx11_(this->CTest);
      std::__cxx11::string::append((string *)&msg);
    }
    std::__cxx11::string::append((char *)&msg);
    poVar6 = std::operator<<(this->TestHandler->LogFile,(string *)&msg);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&msg);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar3 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x1dc,local_1c0[0],false);
    std::__cxx11::string::~string((string *)local_1c0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
    std::__cxx11::string::assign((char *)&(this->TestResult).FullCommandLine);
    std::__cxx11::string::assign((char *)psVar1);
LAB_003133cd:
    (this->TestResult).Status = 0;
    std::__cxx11::string::~string((string *)&msg);
  }
  return false;
}

Assistant:

bool cmCTestRunTest::StartTest(size_t total)
{
  this->TotalNumberOfTests = total; // save for rerun case
  cmCTestLog(this->CTest, HANDLER_OUTPUT, std::setw(2*getNumWidth(total) + 8)
    << "Start "
    << std::setw(getNumWidth(this->TestHandler->GetMaxIndex()))
    << this->TestProperties->Index << ": "
    << this->TestProperties->Name << std::endl);
  this->ComputeArguments();
  std::vector<std::string>& args = this->TestProperties->Args;
  this->TestResult.Properties = this->TestProperties;
  this->TestResult.ExecutionTime = 0;
  this->TestResult.CompressOutput = false;
  this->TestResult.ReturnValue = -1;
  this->TestResult.CompletionStatus = "Failed to start";
  this->TestResult.Status = cmCTestTestHandler::BAD_COMMAND;
  this->TestResult.TestCount = this->TestProperties->Index;
  this->TestResult.Name = this->TestProperties->Name;
  this->TestResult.Path = this->TestProperties->Directory.c_str();

  if(args.size() >= 2 && args[1] == "NOT_AVAILABLE")
    {
    this->TestProcess = new cmProcess;
    std::string msg;
    if(this->CTest->GetConfigType().empty())
      {
      msg = "Test not available without configuration.";
      msg += "  (Missing \"-C <config>\"?)";
      }
    else
      {
      msg = "Test not available in configuration \"";
      msg += this->CTest->GetConfigType();
      msg += "\".";
      }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine = "";
    this->TestResult.CompletionStatus = "Not Run";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
    }

  // Check if all required files exist
  for(std::vector<std::string>::iterator i =
    this->TestProperties->RequiredFiles.begin();
    i != this->TestProperties->RequiredFiles.end(); ++i)
    {
    std::string file = *i;

    if(!cmSystemTools::FileExists(file.c_str()))
      {
      //Required file was not found
      this->TestProcess = new cmProcess;
      *this->TestHandler->LogFile << "Unable to find required file: "
               << file << std::endl;
      cmCTestLog(this->CTest, ERROR_MESSAGE, "Unable to find required file: "
               << file << std::endl);
      this->TestResult.Output = "Unable to find required file: " + file;
      this->TestResult.FullCommandLine = "";
      this->TestResult.CompletionStatus = "Not Run";
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      return false;
      }
    }
  // log and return if we did not find the executable
  if (this->ActualCommand == "")
    {
    // if the command was not found create a TestResult object
    // that has that information
    this->TestProcess = new cmProcess;
    *this->TestHandler->LogFile << "Unable to find executable: "
                   << args[1] << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Unable to find executable: "
               << args[1] << std::endl);
    this->TestResult.Output = "Unable to find executable: " + args[1];
    this->TestResult.FullCommandLine = "";
    this->TestResult.CompletionStatus = "Not Run";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
    }
  this->StartTime = this->CTest->CurrentTime();

  double timeout = this->ResolveTimeout();

  if(this->StopTimePassed)
    {
    return false;
    }
  return this->ForkProcess(timeout, this->TestProperties->ExplicitTimeout,
                           &this->TestProperties->Environment);
}